

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConstructSymbolTableVisitor.cpp
# Opt level: O0

void __thiscall
CConstructSymbolTableVisitor::Visit(CConstructSymbolTableVisitor *this,CCallMethodExp *exp)

{
  bool bVar1;
  pointer pIVar2;
  pointer pCVar3;
  pointer pCVar4;
  CCallMethodExp *exp_local;
  CConstructSymbolTableVisitor *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&exp->objectExpression);
  if (bVar1) {
    pIVar2 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                       (&exp->objectExpression);
    (**(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&exp->methodName);
  if (bVar1) {
    pCVar3 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->(&exp->methodName);
    (**(pCVar3->super_IExpression).super_PositionedNode.super_INode._vptr_INode)(pCVar3,this);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&exp->args);
  if (bVar1) {
    pCVar4 = std::unique_ptr<CExpList,_std::default_delete<CExpList>_>::operator->(&exp->args);
    (**(pCVar4->super_IExpression).super_PositionedNode.super_INode._vptr_INode)(pCVar4,this);
  }
  return;
}

Assistant:

void CConstructSymbolTableVisitor::Visit( CCallMethodExp &exp )
{
	if( exp.objectExpression ) {
		exp.objectExpression->Accept( *this );
	}
	if( exp.methodName ) {
		exp.methodName->Accept( *this );
	}
	if( exp.args ) {
		exp.args->Accept( *this );
	}
}